

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O1

int fsg_model_accept(fsg_model_t *fsg,char *words)

{
  long lVar1;
  char *pcVar2;
  fsg_model_t *fsg_00;
  int iVar3;
  uint uVar4;
  int iVar5;
  bitvec_t *ptr;
  char *line;
  fsg_arciter_t *itor;
  gnode_t *pgVar6;
  uint uVar7;
  int iVar8;
  bitvec_t *pbVar9;
  char delimfound;
  char *word;
  char local_61;
  bitvec_t *local_60;
  char *local_58;
  fsg_model_t *local_50;
  uint local_44;
  char *local_40;
  char *local_38;
  
  uVar4 = 0;
  if (words != (char *)0x0 && fsg != (fsg_model_t *)0x0) {
    iVar5 = fsg->n_state + 0x1f;
    iVar3 = fsg->n_state + 0x3e;
    if (-1 < iVar5) {
      iVar3 = iVar5;
    }
    local_60 = (bitvec_t *)
               __ckd_calloc__((long)(iVar3 >> 5),4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                              ,0x3c3);
    iVar5 = fsg->n_state + 0x1f;
    iVar3 = fsg->n_state + 0x3e;
    if (-1 < iVar5) {
      iVar3 = iVar5;
    }
    ptr = (bitvec_t *)
          __ckd_calloc__((long)(iVar3 >> 5),4,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                         ,0x3c4);
    iVar5 = fsg->start_state;
    iVar3 = iVar5 + 0x1f;
    if (-1 < iVar5) {
      iVar3 = iVar5;
    }
    local_60[iVar3 >> 5] = local_60[iVar3 >> 5] | 1 << ((byte)iVar5 & 0x1f);
    local_50 = fsg;
    line = __ckd_salloc__(words,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                          ,0x3c8);
    local_40 = line;
    do {
      uVar4 = nextword(line," \t\r\n\v\f",&local_58,&local_61);
      fsg_00 = local_50;
      pcVar2 = local_58;
      pbVar9 = local_60;
      if ((int)uVar4 < 0) {
        apply_closure(local_50,local_60);
        uVar4 = fsg_00->final_state;
        uVar7 = uVar4 + 0x1f;
        if (-1 < (int)uVar4) {
          uVar7 = uVar4;
        }
        uVar4 = (uint)((pbVar9[(int)uVar7 >> 5] >> (uVar4 & 0x1f) & 1) != 0);
        goto LAB_0012f025;
      }
      local_44 = uVar4;
      local_38 = line;
      iVar5 = fsg_model_word_id(local_50,local_58);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
              ,0x3cf,"word: %s\n",pcVar2);
      apply_closure(fsg_00,local_60);
      if (iVar5 < 0) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                ,0x3d7,"word %s not found!\n",local_58);
        pbVar9 = ptr;
        line = local_38;
      }
      else {
        iVar3 = fsg_00->n_state;
        if (0 < iVar3) {
          uVar4 = 0;
          do {
            if ((local_60[uVar4 >> 5] >> (uVar4 & 0x1f) & 1) != 0) {
              for (itor = fsg_model_arcs(local_50,uVar4); itor != (fsg_arciter_t *)0x0;
                  itor = fsg_arciter_next(itor)) {
                pgVar6 = itor->gn;
                if (pgVar6 == (gnode_t *)0x0) {
                  pgVar6 = (gnode_t *)&itor->null_itor->ent->val;
                }
                lVar1 = (pgVar6->data).i;
                if (*(int *)(lVar1 + 0xc) == iVar5) {
                  iVar3 = *(int *)(lVar1 + 4);
                  iVar8 = iVar3 + 0x1f;
                  if (-1 < iVar3) {
                    iVar8 = iVar3;
                  }
                  ptr[iVar8 >> 5] = ptr[iVar8 >> 5] | 1 << ((byte)iVar3 & 0x1f);
                  err_msg(ERR_INFO,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                          ,0x3e6,"%s %d -> %d\n",local_58,(ulong)uVar4,*(undefined4 *)(lVar1 + 4));
                }
              }
            }
            uVar4 = uVar4 + 1;
            iVar3 = local_50->n_state;
          } while ((int)uVar4 < iVar3);
        }
        pbVar9 = local_60;
        iVar8 = iVar3 + 0x3e;
        if (-1 < iVar3 + 0x1f) {
          iVar8 = iVar3 + 0x1f;
        }
        memset(local_60,0,(long)(iVar8 >> 5) << 2);
        local_58[local_44] = local_61;
        line = local_58 + local_44;
        local_60 = ptr;
      }
      ptr = pbVar9;
    } while (-1 < iVar5);
    uVar4 = 0;
    pbVar9 = local_60;
LAB_0012f025:
    ckd_free(pbVar9);
    ckd_free(ptr);
    ckd_free(local_40);
  }
  return uVar4;
}

Assistant:

int
fsg_model_accept(fsg_model_t *fsg, char const *words)
{
    char *ptr, *mutable_words, *word, delimfound;
    bitvec_t *active, *next;
    int n, found = 0;

    if (fsg == NULL || words == NULL)
        return 0;

    active = bitvec_alloc(fsg_model_n_state(fsg));
    next = bitvec_alloc(fsg_model_n_state(fsg));
    bitvec_set(active, fsg_model_start_state(fsg));

    /* For each input word */
    ptr = mutable_words = ckd_salloc(words);
    while ((n = nextword(ptr, " \t\r\n\v\f",
                         &word, &delimfound)) >= 0) {
        int wid = fsg_model_word_id(fsg, word);
        int state;
        bitvec_t *tmp;

        E_INFO("word: %s\n", word);
        /* Expand using previously calculated closure. */
        apply_closure(fsg, active);

        /* Consume the current word, following all non-epsilon
         * transitions possible. */
        if (wid < 0) {
            /* Immediate fail */
            E_INFO("word %s not found!\n", word);
            goto done;
        }
        /* Again, my apologies, this is a bit slow. */
        for (state = 0; state < fsg_model_n_state(fsg); ++state) {
            fsg_arciter_t *itor;
            if (!bitvec_is_set(active, state))
                continue;
            for (itor = fsg_model_arcs(fsg, state);
                 itor != NULL; itor = fsg_arciter_next(itor)) {
                fsg_link_t *link = fsg_arciter_get(itor);
                /* Ignore epsilons, we already did them. */
                if (link->wid == wid) {
                    bitvec_set(next, link->to_state);
                    E_INFO("%s %d -> %d\n",
                           word, state, link->to_state);
                }
            }
        }

        /* Update active list. */
        tmp = active;
        active = next;
        next = tmp;
        bitvec_clear_all(next, fsg_model_n_state(fsg));
        
        word[n] = delimfound;
        ptr = word + n;
    }
    /* Did we reach the final state? First expand any epsilons, then
     * we'll find out! */
    apply_closure(fsg, active);
    found = bitvec_is_set(active, fsg_model_final_state(fsg));

done:
    bitvec_free(active);
    bitvec_free(next);
    ckd_free(mutable_words);
    return found != 0;
}